

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void border_cb(Fl_Light_Button *i,void *v)

{
  Fl_Window *this;
  char cVar1;
  int iVar2;
  uint v_00;
  void *v_local;
  Fl_Light_Button *i_local;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
    if (iVar2 == 0) {
      (*(i->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget[6])();
    }
    else {
      (*(i->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget[5])();
      v_00 = Fl_Window::border((Fl_Window *)current_widget->o);
      Fl_Button::value(&i->super_Fl_Button,v_00);
    }
  }
  else {
    this = (Fl_Window *)current_widget->o;
    cVar1 = Fl_Button::value(&i->super_Fl_Button);
    Fl_Window::border(this,(int)cVar1);
    set_modflag(1);
  }
  return;
}

Assistant:

void border_cb(Fl_Light_Button* i, void* v) {
  if (v == LOAD) {
    if (!current_widget->is_window()) {i->hide(); return;}
    i->show();
    i->value(((Fl_Window*)(current_widget->o))->border());
  } else {
    ((Fl_Window*)(current_widget->o))->border(i->value());
    set_modflag(1);
  }
}